

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dot.hpp
# Opt level: O2

void remora::bindings::
     dot<remora::dense_vector_adaptor<double_const,remora::dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,double>
               (undefined8 *v1,undefined8 *v2,double *result)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  bool bVar6;
  double dVar7;
  
  *result = 0.0;
  pdVar3 = (double *)*v1;
  lVar4 = v1[1];
  lVar1 = v1[2];
  pdVar5 = (double *)*v2;
  lVar2 = v2[2];
  dVar7 = 0.0;
  while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
    dVar7 = dVar7 + *pdVar3 * *pdVar5;
    *result = dVar7;
    pdVar5 = pdVar5 + lVar2;
    pdVar3 = pdVar3 + lVar1;
  }
  return;
}

Assistant:

void dot(
	vector_expression<E1, cpu_tag> const& v1,
	vector_expression<E2, cpu_tag> const& v2,
	result_type& result,
	dense_tag,
	dense_tag
) {
	result = result_type();
	auto v1_end = v1().end();
	auto v2_pos = v2().begin();
	for(auto v1_pos = v1().begin(); v1_pos != v1_end; ++v1_pos, ++v2_pos){
		result += (*v1_pos) * (*v2_pos);
	}
}